

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
::remove_values(btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                *this,field_type i,field_type to_erase,allocator_type *alloc)

{
  byte bVar1;
  bool bVar2;
  byte i_00;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *pbVar3;
  template_ElementType<2UL> *ptVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  allocator_type *alloc_00;
  allocator_type *in_R9;
  field_type fVar7;
  byte i_01;
  ulong uVar8;
  
  uVar6 = CONCAT71(in_register_00000031,i);
  uVar8 = uVar6 & 0xffffffff;
  value_destroy_n(this,i,to_erase,alloc);
  bVar1 = finish(this);
  uVar5 = (uint)to_erase + (int)uVar6 & 0xff;
  transfer_n(this,(long)(int)(bVar1 - uVar5),uVar6 & 0xffffffff,(ulong)uVar5,this,in_R9);
  bVar2 = is_internal(this);
  if (bVar2) {
    uVar6 = (ulong)((int)uVar6 + 1);
    fVar7 = to_erase;
    while (bVar2 = fVar7 != '\0', fVar7 = fVar7 + 0xff, bVar2) {
      alloc_00 = (allocator_type *)(uVar6 & 0xff);
      pbVar3 = child(this,(field_type)uVar6);
      clear_and_delete(pbVar3,alloc_00);
      uVar6 = (ulong)(byte)((field_type)uVar6 + 1);
    }
    while( true ) {
      i_01 = (char)uVar8 + 1;
      i_00 = to_erase + i_01;
      if (bVar1 < i_00) break;
      pbVar3 = child(this,i_00);
      uVar8 = (ulong)i_01;
      set_child(this,i_01,pbVar3);
      mutable_child(this,i_00);
    }
  }
  ptVar4 = btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>
           ::GetField<2ul>((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>
                            *)this);
  ptVar4[2] = bVar1 - to_erase;
  return;
}

Assistant:

inline void btree_node<P>::remove_values(const field_type i,
                                         const field_type to_erase,
                                         allocator_type *alloc) {
  // Transfer values after the removed range into their new places.
  value_destroy_n(i, to_erase, alloc);
  const field_type orig_finish = finish();
  const field_type src_i = i + to_erase;
  transfer_n(orig_finish - src_i, i, src_i, this, alloc);

  if (is_internal()) {
    // Delete all children between begin and end.
    for (field_type j = 0; j < to_erase; ++j) {
      clear_and_delete(child(i + j + 1), alloc);
    }
    // Rotate children after end into new positions.
    for (field_type j = i + to_erase + 1; j <= orig_finish; ++j) {
      set_child(j - to_erase, child(j));
      clear_child(j);
    }
  }
  set_finish(orig_finish - to_erase);
}